

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void SetClipboardTextFn_DefaultImpl(void *param_1,char *text)

{
  int *piVar1;
  char *pcVar2;
  int iVar3;
  ImGuiContext *pIVar4;
  size_t __n;
  char *__dest;
  int iVar5;
  ImGuiContext *ctx;
  int iVar6;
  
  pIVar4 = GImGui;
  pcVar2 = (GImGui->PrivateClipboard).Data;
  if (pcVar2 != (char *)0x0) {
    (pIVar4->PrivateClipboard).Size = 0;
    (pIVar4->PrivateClipboard).Capacity = 0;
    piVar1 = &(pIVar4->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + -1;
    (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
    (pIVar4->PrivateClipboard).Data = (char *)0x0;
  }
  __n = strlen(text);
  iVar3 = (int)__n;
  iVar5 = iVar3 + 1;
  iVar6 = (pIVar4->PrivateClipboard).Capacity;
  if (iVar3 < iVar6) {
    __dest = (char *)0x0;
  }
  else {
    if (iVar6 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar6 / 2 + iVar6;
    }
    if (iVar6 <= iVar5) {
      iVar6 = iVar5;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (char *)(*GImAllocatorAllocFunc)((long)iVar6,GImAllocatorUserData);
    pcVar2 = (pIVar4->PrivateClipboard).Data;
    if (pcVar2 != (char *)0x0) {
      memcpy(__dest,pcVar2,(long)(pIVar4->PrivateClipboard).Size);
      pcVar2 = (pIVar4->PrivateClipboard).Data;
      if ((pcVar2 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
    }
    (pIVar4->PrivateClipboard).Data = __dest;
    (pIVar4->PrivateClipboard).Capacity = iVar6;
  }
  (pIVar4->PrivateClipboard).Size = iVar5;
  memcpy(__dest,text,__n);
  (pIVar4->PrivateClipboard).Data[iVar3] = '\0';
  return;
}

Assistant:

static void SetClipboardTextFn_DefaultImpl(void*, const char* text)
{
    ImGuiContext& g = *GImGui;
    g.PrivateClipboard.clear();
    const char* text_end = text + strlen(text);
    g.PrivateClipboard.resize((int)(text_end - text) + 1);
    memcpy(&g.PrivateClipboard[0], text, (size_t)(text_end - text));
    g.PrivateClipboard[(int)(text_end - text)] = 0;
}